

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DragBehavior(ImGuiID id,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                        void *v_max,char *format,float power)

{
  char cVar1;
  ImGuiID IVar2;
  uint uVar3;
  ImGuiInputSource IVar4;
  bool bVar5;
  ImVec2 IVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  ImGuiContext *pIVar11;
  uint uVar12;
  ulong extraout_RAX;
  ulong uVar13;
  ulong extraout_RAX_00;
  undefined7 uVar16;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  char *pcVar14;
  ulong extraout_RAX_04;
  char *extraout_RAX_05;
  ulong extraout_RAX_06;
  char *extraout_RAX_07;
  char *pcVar15;
  bool bVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ImGuiContext *g;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  char v_str [64];
  double local_e8;
  ulong local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [15];
  char cStack_79;
  char local_78 [72];
  
  pIVar11 = GImGui;
  IVar2 = GImGui->ActiveId;
  if (IVar2 == id) {
    if (GImGui->ActiveIdSource == ImGuiInputSource_Nav) {
      if (GImGui->NavActivatePressedId == id) {
        cVar1 = GImGui->ActiveIdIsJustActivated;
        goto joined_r0x0018e0de;
      }
    }
    else if (GImGui->ActiveIdSource == ImGuiInputSource_Mouse) {
      cVar1 = (GImGui->IO).MouseDown[0];
joined_r0x0018e0de:
      if (cVar1 == '\0') {
        GImGui->ActiveIdIsJustActivated = IVar2 != 0;
        if (IVar2 != 0) {
          pIVar11->ActiveIdTimer = 0.0;
        }
        pIVar11->ActiveId = 0;
        pIVar11->ActiveIdAllowNavDirFlags = 0;
        pIVar11->ActiveIdAllowOverlap = false;
        pIVar11->ActiveIdWindow = (ImGuiWindow *)0x0;
      }
    }
  }
  if (pIVar11->ActiveId == id) {
    switch(data_type) {
    case 0:
      if (v_min == (void *)0x0) {
        iVar21 = -0x80000000;
      }
      else {
        iVar21 = *v_min;
      }
      if (v_max == (void *)0x0) {
        iVar19 = 0x7fffffff;
      }
      else {
        iVar19 = *v_max;
      }
      fVar26 = 0.0;
      if (v_speed == 0.0 && iVar19 - iVar21 != 0) {
        v_speed = (float)(iVar19 - iVar21) * pIVar11->DragSpeedDefaultRatio;
      }
      IVar4 = pIVar11->ActiveIdSource;
      uVar23 = (ulong)IVar4;
      if ((((IVar4 == ImGuiInputSource_Mouse) && (-256000.0 <= (pIVar11->IO).MousePos.x)) &&
          (-256000.0 <= (pIVar11->IO).MousePos.y)) &&
         (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])) {
        fVar26 = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          fVar26 = fVar26 * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          fVar26 = fVar26 * 10.0;
        }
      }
      if (IVar4 == ImGuiInputSource_Nav) {
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        fVar26 = IVar6.x;
        uVar23 = extraout_RAX_01;
        if (v_speed <= 1.0) {
          v_speed = 1.0;
        }
      }
      fVar26 = fVar26 * v_speed;
      uVar16 = (undefined7)(uVar23 >> 8);
      pcVar14 = (char *)CONCAT71(uVar16,pIVar11->ActiveIdIsJustActivated);
      if (iVar19 == iVar21) {
        bVar17 = false;
      }
      else if ((*v < iVar19) || (bVar17 = true, fVar26 <= 0.0)) {
        bVar17 = fVar26 < 0.0 && *v <= iVar21;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        pcVar14 = (char *)0x0;
LAB_0018e712:
        pIVar11->DragCurrentAccumDirty = SUB81(pcVar14,0);
      }
      else if ((fVar26 != 0.0) || (NAN(fVar26))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + fVar26;
        pcVar14 = (char *)CONCAT71(uVar16,1);
        goto LAB_0018e712;
      }
      if (pIVar11->DragCurrentAccumDirty != true) goto LAB_0018f250;
      local_c0._0_4_ = (int)pIVar11->DragCurrentAccum + *v;
      do {
        cVar1 = *format;
        if (cVar1 == '\0') {
          iVar18 = 3;
          pcVar15 = pcVar14;
        }
        else if ((cVar1 != '%') || (iVar18 = 1, pcVar15 = format, format[1] == '%')) {
          format = format + (ulong)(cVar1 == '%') + 1;
          iVar18 = 0;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15;
      } while (iVar18 == 0);
      if (iVar18 == 1) {
        format = pcVar15;
      }
      if ((*format == '%') && (format[1] != '%')) {
        ImFormatString(local_78,0x40,format);
        pcVar14 = &cStack_79;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 == ' ');
        ImAtoi<int>(pcVar14,(int *)&local_c0);
      }
      pIVar11->DragCurrentAccumDirty = false;
      iVar18 = *v;
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)(int)((uint)local_c0 - iVar18);
      if ((iVar19 != iVar21) && ((uint)local_c0 != iVar18)) {
        if (((int)(uint)local_c0 < iVar21) || ((iVar18 < (int)(uint)local_c0 && (fVar26 < 0.0)))) {
          local_c0._0_4_ = iVar21;
        }
        if ((iVar19 < (int)(uint)local_c0) || (((int)(uint)local_c0 < iVar18 && (0.0 < fVar26)))) {
          local_c0._0_4_ = iVar19;
        }
      }
      if (iVar18 == (uint)local_c0) {
        return iVar18 != (uint)local_c0;
      }
      *(uint *)v = (uint)local_c0;
      break;
    case 1:
      if (v_min == (void *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar12 = *v_min;
      }
      if (v_max == (void *)0x0) {
        uVar20 = 0xffffffff;
      }
      else {
        uVar20 = *v_max;
      }
      fVar26 = 0.0;
      if (v_speed == 0.0 && uVar20 - uVar12 != 0) {
        v_speed = (float)(uVar20 - uVar12) * pIVar11->DragSpeedDefaultRatio;
      }
      IVar4 = pIVar11->ActiveIdSource;
      uVar23 = (ulong)IVar4;
      if ((((IVar4 == ImGuiInputSource_Mouse) && (-256000.0 <= (pIVar11->IO).MousePos.x)) &&
          (-256000.0 <= (pIVar11->IO).MousePos.y)) &&
         (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])) {
        fVar26 = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          fVar26 = fVar26 * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          fVar26 = fVar26 * 10.0;
        }
      }
      if (IVar4 == ImGuiInputSource_Nav) {
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        fVar26 = IVar6.x;
        uVar23 = extraout_RAX_02;
        if (v_speed <= 1.0) {
          v_speed = 1.0;
        }
      }
      fVar26 = fVar26 * v_speed;
      uVar16 = (undefined7)(uVar23 >> 8);
      pcVar14 = (char *)CONCAT71(uVar16,pIVar11->ActiveIdIsJustActivated);
      if (uVar20 == uVar12) {
        bVar17 = false;
      }
      else if ((*v < uVar20) || (bVar17 = true, fVar26 <= 0.0)) {
        bVar17 = fVar26 < 0.0 && *v <= uVar12;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        pcVar14 = (char *)0x0;
LAB_0018e974:
        pIVar11->DragCurrentAccumDirty = SUB81(pcVar14,0);
      }
      else if ((fVar26 != 0.0) || (NAN(fVar26))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + fVar26;
        pcVar14 = (char *)CONCAT71(uVar16,1);
        goto LAB_0018e974;
      }
      if (pIVar11->DragCurrentAccumDirty != true) goto LAB_0018f250;
      local_c0._0_4_ = (int)(long)pIVar11->DragCurrentAccum + *v;
      do {
        cVar1 = *format;
        if (cVar1 == '\0') {
          iVar21 = 3;
          pcVar15 = pcVar14;
        }
        else if ((cVar1 != '%') || (iVar21 = 1, pcVar15 = format, format[1] == '%')) {
          format = format + (ulong)(cVar1 == '%') + 1;
          iVar21 = 0;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15;
      } while (iVar21 == 0);
      if (iVar21 == 1) {
        format = pcVar15;
      }
      if ((*format == '%') && (format[1] != '%')) {
        ImFormatString(local_78,0x40,format);
        pcVar14 = &cStack_79;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 == ' ');
        ImAtoi<int>(pcVar14,(int *)&local_c0);
      }
      pIVar11->DragCurrentAccumDirty = false;
      uVar3 = *v;
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)(int)((uint)local_c0 - uVar3);
      if ((uVar20 != uVar12) && ((uint)local_c0 != uVar3)) {
        if (((uint)local_c0 < uVar12) || ((uVar3 < (uint)local_c0 && (fVar26 < 0.0)))) {
          local_c0._0_4_ = uVar12;
        }
        if ((uVar20 < (uint)local_c0) || (((uint)local_c0 < uVar3 && (0.0 < fVar26)))) {
          local_c0._0_4_ = uVar20;
        }
      }
      if (uVar3 == (uint)local_c0) {
        return uVar3 != (uint)local_c0;
      }
      *(uint *)v = (uint)local_c0;
      break;
    case 2:
      uVar22 = 0x7fffffffffffffff;
      if (v_min == (void *)0x0) {
        uVar23 = 0x8000000000000000;
      }
      else {
        uVar23 = *v_min;
      }
      if (v_max != (void *)0x0) {
        uVar22 = *v_max;
      }
      fVar26 = 0.0;
      if (v_speed == 0.0 && uVar22 - uVar23 != 0) {
        v_speed = (float)(long)(uVar22 - uVar23) * pIVar11->DragSpeedDefaultRatio;
      }
      IVar4 = pIVar11->ActiveIdSource;
      uVar13 = (ulong)IVar4;
      if ((((IVar4 == ImGuiInputSource_Mouse) && (-256000.0 <= (pIVar11->IO).MousePos.x)) &&
          (-256000.0 <= (pIVar11->IO).MousePos.y)) &&
         (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])) {
        fVar26 = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          fVar26 = fVar26 * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          fVar26 = fVar26 * 10.0;
        }
      }
      if (IVar4 == ImGuiInputSource_Nav) {
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        fVar26 = IVar6.x;
        uVar13 = extraout_RAX_00;
        if (v_speed <= 1.0) {
          v_speed = 1.0;
        }
      }
      fVar26 = fVar26 * v_speed;
      uVar16 = (undefined7)(uVar13 >> 8);
      pcVar14 = (char *)CONCAT71(uVar16,pIVar11->ActiveIdIsJustActivated);
      if (uVar22 == uVar23) {
        bVar17 = false;
      }
      else if ((*v < (long)uVar22) || (bVar17 = true, fVar26 <= 0.0)) {
        bVar17 = fVar26 < 0.0 && *v <= (long)uVar23;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        pcVar14 = (char *)0x0;
LAB_0018e43e:
        pIVar11->DragCurrentAccumDirty = SUB81(pcVar14,0);
      }
      else if ((fVar26 != 0.0) || (NAN(fVar26))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + fVar26;
        pcVar14 = (char *)CONCAT71(uVar16,1);
        goto LAB_0018e43e;
      }
      if (pIVar11->DragCurrentAccumDirty == true) {
        local_c0 = (long)pIVar11->DragCurrentAccum + *v;
        do {
          cVar1 = *format;
          if (cVar1 == '\0') {
            iVar21 = 3;
            pcVar15 = pcVar14;
          }
          else if ((cVar1 != '%') || (iVar21 = 1, pcVar15 = format, format[1] == '%')) {
            format = format + (ulong)(cVar1 == '%') + 1;
            iVar21 = 0;
            pcVar15 = pcVar14;
          }
          pcVar14 = pcVar15;
        } while (iVar21 == 0);
        if (iVar21 == 1) {
          format = pcVar15;
        }
        if ((*format == '%') && (format[1] != '%')) {
          ImFormatString(local_78,0x40,format);
          pcVar14 = &cStack_79;
          do {
            pcVar15 = pcVar14 + 1;
            pcVar14 = pcVar14 + 1;
          } while (*pcVar15 == ' ');
          ImAtoi<long_long>(pcVar14,(longlong *)&local_c0);
        }
        pIVar11->DragCurrentAccumDirty = false;
        uVar13 = *v;
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)(long)(local_c0 - uVar13);
        if ((uVar22 != uVar23) && (local_c0 != uVar13)) {
          if (((long)local_c0 < (long)uVar23) || (((long)uVar13 < (long)local_c0 && (fVar26 < 0.0)))
             ) {
            local_c0 = uVar23;
          }
          if ((long)uVar22 < (long)local_c0) goto LAB_0018ee4c;
          if ((long)local_c0 < (long)uVar13) goto LAB_0018ee44;
        }
        goto LAB_0018ee4f;
      }
      goto LAB_0018f250;
    case 3:
      if (v_min == (void *)0x0) {
        uVar23 = 0;
      }
      else {
        uVar23 = *v_min;
      }
      if (v_max == (void *)0x0) {
        uVar22 = 0xffffffffffffffff;
      }
      else {
        uVar22 = *v_max;
      }
      fVar26 = 0.0;
      if (v_speed == 0.0 && uVar22 - uVar23 != 0) {
        v_speed = (float)(uVar22 - uVar23) * pIVar11->DragSpeedDefaultRatio;
      }
      if ((((pIVar11->ActiveIdSource == ImGuiInputSource_Mouse) &&
           (-256000.0 <= (pIVar11->IO).MousePos.x)) && (-256000.0 <= (pIVar11->IO).MousePos.y)) &&
         (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])) {
        fVar26 = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          fVar26 = fVar26 * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          fVar26 = fVar26 * 10.0;
        }
      }
      if (pIVar11->ActiveIdSource == ImGuiInputSource_Nav) {
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        fVar26 = IVar6.x;
        if (v_speed <= 1.0) {
          v_speed = 1.0;
        }
      }
      fVar26 = fVar26 * v_speed;
      if (uVar22 == uVar23) {
        bVar17 = false;
      }
      else if ((*v < uVar22) || (bVar17 = true, fVar26 <= 0.0)) {
        bVar17 = fVar26 < 0.0 && *v <= uVar23;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        bVar17 = false;
LAB_0018ed1c:
        pIVar11->DragCurrentAccumDirty = bVar17;
      }
      else if ((fVar26 != 0.0) || (NAN(fVar26))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + fVar26;
        bVar17 = true;
        goto LAB_0018ed1c;
      }
      if (pIVar11->DragCurrentAccumDirty != true) goto LAB_0018f250;
      pcVar14 = (char *)(long)pIVar11->DragCurrentAccum;
      local_c0 = ((long)(pIVar11->DragCurrentAccum - 9.223372e+18) & (long)pcVar14 >> 0x3f |
                 (ulong)pcVar14) + *v;
      do {
        cVar1 = *format;
        if (cVar1 == '\0') {
          iVar21 = 3;
          pcVar15 = pcVar14;
        }
        else if ((cVar1 != '%') || (iVar21 = 1, pcVar15 = format, format[1] == '%')) {
          format = format + (ulong)(cVar1 == '%') + 1;
          iVar21 = 0;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15;
      } while (iVar21 == 0);
      if (iVar21 == 1) {
        format = pcVar15;
      }
      if ((*format == '%') && (format[1] != '%')) {
        ImFormatString(local_78,0x40,format);
        pcVar14 = &cStack_79;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 == ' ');
        ImAtoi<long_long>(pcVar14,(longlong *)&local_c0);
      }
      pIVar11->DragCurrentAccumDirty = false;
      uVar13 = *v;
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)(long)(local_c0 - uVar13);
      if ((uVar22 != uVar23) && (local_c0 != uVar13)) {
        if ((local_c0 < uVar23) || ((uVar13 < local_c0 && (fVar26 < 0.0)))) {
          local_c0 = uVar23;
        }
        if (local_c0 <= uVar22) {
          if (uVar13 <= local_c0) goto LAB_0018ee4f;
LAB_0018ee44:
          if (fVar26 <= 0.0) goto LAB_0018ee4f;
        }
LAB_0018ee4c:
        local_c0 = uVar22;
      }
LAB_0018ee4f:
      if (uVar13 == local_c0) {
        return uVar13 != local_c0;
      }
      *(ulong *)v = local_c0;
      break;
    case 4:
      if (v_min == (void *)0x0) {
        fVar26 = -3.4028235e+38;
      }
      else {
        fVar26 = *v_min;
      }
      if (v_max == (void *)0x0) {
        fVar25 = 3.4028235e+38;
      }
      else {
        fVar25 = *v_max;
      }
      bVar5 = fVar26 != fVar25;
      bVar17 = fVar25 - fVar25 < 3.4028235e+38;
      bVar9 = bVar17 && bVar5;
      local_98._0_4_ = 0.0;
      if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar17 && bVar5)) {
        v_speed = (fVar25 - fVar26) * pIVar11->DragSpeedDefaultRatio;
      }
      IVar4 = pIVar11->ActiveIdSource;
      uVar23 = (ulong)IVar4;
      if (((IVar4 == ImGuiInputSource_Mouse) && (-256000.0 <= (pIVar11->IO).MousePos.x)) &&
         ((-256000.0 <= (pIVar11->IO).MousePos.y && (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])
          ))) {
        local_98._0_4_ = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          local_98._0_4_ = (float)local_98._0_4_ * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          local_98._0_4_ = (float)local_98._0_4_ * 10.0;
        }
      }
      uStack_8c = 0;
      uStack_90 = 0;
      local_98._4_4_ = 0.0;
      local_b8 = ZEXT416((uint)fVar26);
      local_a8 = ZEXT416((uint)fVar25);
      if (IVar4 == ImGuiInputSource_Nav) {
        uVar12 = ImParseFormatPrecision(format,3);
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        local_98._0_4_ = IVar6.x;
        local_98._4_4_ = IVar6.y;
        uStack_90 = extraout_XMM0_Dc;
        uStack_8c = extraout_XMM0_Dd;
        if ((int)uVar12 < 0) {
          fVar26 = 1.1754944e-38;
          uVar23 = extraout_RAX;
        }
        else if ((int)uVar12 < 10) {
          uVar23 = (ulong)uVar12;
          fVar26 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + uVar23 * 4);
        }
        else {
          local_98._0_4_ = IVar6.x;
          local_98._4_4_ = IVar6.y;
          fVar26 = powf(10.0,(float)(int)-uVar12);
          uVar23 = extraout_RAX_04;
        }
        v_speed = (float)((uint)v_speed & -(uint)(fVar26 <= v_speed) |
                         ~-(uint)(fVar26 <= v_speed) & (uint)fVar26);
        fVar25 = (float)local_a8._0_4_;
        fVar26 = (float)local_b8._0_4_;
      }
      local_98._0_4_ = (float)local_98._0_4_ * v_speed;
      uVar16 = (undefined7)(uVar23 >> 8);
      pcVar14 = (char *)CONCAT71(uVar16,pIVar11->ActiveIdIsJustActivated);
      if (bVar17 && bVar5) {
        if ((*v < fVar25) || (bVar17 = true, (float)local_98._0_4_ <= 0.0)) {
          bVar17 = *v <= fVar26 && (float)local_98._0_4_ < 0.0;
        }
      }
      else {
        bVar17 = false;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        pcVar14 = (char *)0x0;
LAB_0018ef36:
        pIVar11->DragCurrentAccumDirty = SUB81(pcVar14,0);
      }
      else if (((float)local_98._0_4_ != 0.0) || (NAN((float)local_98._0_4_))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + (float)local_98._0_4_;
        pcVar14 = (char *)CONCAT71(uVar16,1);
        goto LAB_0018ef36;
      }
      if (pIVar11->DragCurrentAccumDirty != true) goto LAB_0018f250;
      bVar17 = bVar9;
      if ((power == 1.0) && (!NAN(power))) {
        bVar17 = false;
      }
      fVar25 = fVar25 - fVar26;
      if (bVar17) {
        local_88._0_4_ = powf((*v - fVar26) / fVar25,1.0 / power);
        fVar24 = (float)local_88._0_4_ + pIVar11->DragCurrentAccum / fVar25;
        fVar26 = 1.0;
        if (fVar24 <= 1.0) {
          fVar26 = fVar24;
        }
        fVar26 = powf((float)(~-(uint)(fVar24 < 0.0) & (uint)fVar26),power);
        fVar24 = fVar26 * fVar25 + (float)local_b8._0_4_;
        pcVar14 = extraout_RAX_05;
        fVar26 = (float)local_b8._0_4_;
      }
      else {
        fVar24 = *v + pIVar11->DragCurrentAccum;
        auVar10._12_4_ = 0;
        auVar10._0_12_ = stack0xffffffffffffff7c;
        _local_88 = auVar10 << 0x20;
      }
      do {
        cVar1 = *format;
        if (cVar1 == '\0') {
          iVar21 = 3;
          pcVar15 = pcVar14;
        }
        else if ((cVar1 != '%') || (iVar21 = 1, pcVar15 = format, format[1] == '%')) {
          format = format + (ulong)(cVar1 == '%') + 1;
          iVar21 = 0;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15;
      } while (iVar21 == 0);
      if (iVar21 == 1) {
        format = pcVar15;
      }
      if ((*format == '%') && (format[1] != '%')) {
        ImFormatString(local_78,0x40,format,SUB84((double)fVar24,0));
        pcVar14 = &cStack_79;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 == ' ');
        dVar7 = atof(pcVar14);
        fVar24 = (float)dVar7;
        fVar26 = (float)local_b8._0_4_;
      }
      pIVar11->DragCurrentAccumDirty = false;
      if (bVar17) {
        fVar26 = powf((fVar24 - fVar26) / fVar25,1.0 / power);
        fVar26 = fVar26 - (float)local_88._0_4_;
      }
      else {
        fVar26 = fVar24 - *v;
      }
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - fVar26;
      fVar24 = (float)(~-(uint)(fVar24 == 0.0) & (uint)fVar24);
      fVar26 = *v;
      if (!(bool)(~bVar9 & 1) && fVar24 != fVar26) {
        if ((fVar24 < (float)local_b8._0_4_) || ((fVar26 < fVar24 && ((float)local_98._0_4_ < 0.0)))
           ) {
          fVar24 = (float)local_b8._0_4_;
        }
        if (((float)local_a8._0_4_ < fVar24) || ((fVar24 < fVar26 && (0.0 < (float)local_98._0_4_)))
           ) {
          fVar24 = (float)local_a8._0_4_;
        }
      }
      if ((fVar26 == fVar24) && (!NAN(fVar26) && !NAN(fVar24))) {
        bVar17 = fVar26 != fVar24;
LAB_0018f4b8:
        return (bool)(-bVar17 & 1);
      }
      *(float *)v = fVar24;
      break;
    case 5:
      if (v_min == (void *)0x0) {
        local_a8._0_4_ = 0xffffffff;
        local_a8._4_4_ = 0xffefffff;
      }
      else {
        local_a8._0_4_ = (undefined4)*v_min;
        local_a8._4_4_ = (undefined4)((ulong)*v_min >> 0x20);
      }
      if (v_max == (void *)0x0) {
        local_b8._0_4_ = 0xffffffff;
        local_b8._4_4_ = 0x7fefffff;
      }
      else {
        local_b8._0_4_ = (undefined4)*v_max;
        local_b8._4_4_ = (undefined4)((ulong)*v_max >> 0x20);
      }
      bVar5 = (double)CONCAT44(local_a8._4_4_,local_a8._0_4_) !=
              (double)CONCAT44(local_b8._4_4_,local_b8._0_4_);
      bVar17 = (double)CONCAT44(local_b8._4_4_,local_b8._0_4_) -
               (double)CONCAT44(local_b8._4_4_,local_b8._0_4_) < 3.4028234663852886e+38;
      bVar9 = bVar17 && bVar5;
      local_98._0_4_ = 0.0;
      if (((v_speed == 0.0) && (!NAN(v_speed))) && (bVar17 && bVar5)) {
        v_speed = (float)((double)pIVar11->DragSpeedDefaultRatio *
                         ((double)CONCAT44(local_b8._4_4_,local_b8._0_4_) -
                         (double)CONCAT44(local_a8._4_4_,local_a8._0_4_)));
      }
      IVar4 = pIVar11->ActiveIdSource;
      uVar23 = (ulong)IVar4;
      if (((IVar4 == ImGuiInputSource_Mouse) && (-256000.0 <= (pIVar11->IO).MousePos.x)) &&
         ((-256000.0 <= (pIVar11->IO).MousePos.y && (1.0 < (pIVar11->IO).MouseDragMaxDistanceSqr[0])
          ))) {
        local_98._0_4_ = (pIVar11->IO).MouseDelta.x;
        if ((pIVar11->IO).KeyAlt != false) {
          local_98._0_4_ = (float)local_98._0_4_ * 0.01;
        }
        if ((pIVar11->IO).KeyShift == true) {
          local_98._0_4_ = (float)local_98._0_4_ * 10.0;
        }
      }
      uStack_8c = 0;
      uStack_90 = 0;
      local_98._4_4_ = 0.0;
      local_a8._8_8_ = 0;
      local_b8._8_8_ = 0;
      uVar29 = local_b8._0_4_;
      uVar30 = local_b8._4_4_;
      uVar27 = 0;
      uVar28 = 0;
      uVar31 = local_a8._0_4_;
      uVar32 = local_a8._4_4_;
      if (IVar4 == ImGuiInputSource_Nav) {
        uVar12 = ImParseFormatPrecision(format,3);
        IVar6 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
        local_98._0_4_ = IVar6.x;
        local_98._4_4_ = IVar6.y;
        uStack_90 = extraout_XMM0_Dc_00;
        uStack_8c = extraout_XMM0_Dd_00;
        if ((int)uVar12 < 0) {
          fVar26 = 1.1754944e-38;
          uVar23 = extraout_RAX_03;
        }
        else if ((int)uVar12 < 10) {
          uVar23 = (ulong)uVar12;
          fVar26 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + uVar23 * 4);
        }
        else {
          local_98._0_4_ = IVar6.x;
          local_98._4_4_ = IVar6.y;
          fVar26 = powf(10.0,(float)(int)-uVar12);
          uVar23 = extraout_RAX_06;
        }
        v_speed = (float)((uint)v_speed & -(uint)(fVar26 <= v_speed) |
                         ~-(uint)(fVar26 <= v_speed) & (uint)fVar26);
        uVar29 = local_b8._0_4_;
        uVar30 = local_b8._4_4_;
        uVar27 = local_b8._8_4_;
        uVar28 = local_b8._12_4_;
        uVar31 = local_a8._0_4_;
        uVar32 = local_a8._4_4_;
      }
      local_98._0_4_ = (float)local_98._0_4_ * v_speed;
      uVar16 = (undefined7)(uVar23 >> 8);
      pcVar14 = (char *)CONCAT71(uVar16,pIVar11->ActiveIdIsJustActivated);
      if (bVar17 && bVar5) {
        if ((*v < (double)CONCAT44(uVar30,uVar29)) || (bVar17 = true, (float)local_98._0_4_ <= 0.0))
        {
          bVar17 = (float)local_98._0_4_ < 0.0 && *v <= (double)CONCAT44(uVar32,uVar31);
        }
      }
      else {
        bVar17 = false;
      }
      if ((pIVar11->ActiveIdIsJustActivated != false) || (bVar17)) {
        pIVar11->DragCurrentAccum = 0.0;
        pcVar14 = (char *)0x0;
LAB_0018f22f:
        pIVar11->DragCurrentAccumDirty = SUB81(pcVar14,0);
      }
      else if (((float)local_98._0_4_ != 0.0) || (NAN((float)local_98._0_4_))) {
        pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum + (float)local_98._0_4_;
        pcVar14 = (char *)CONCAT71(uVar16,1);
        goto LAB_0018f22f;
      }
      if (pIVar11->DragCurrentAccumDirty != true) goto LAB_0018f250;
      bVar17 = bVar9;
      if ((power == 1.0) && (!NAN(power))) {
        bVar17 = false;
      }
      if (bVar17) {
        dVar7 = (double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar32,uVar31);
        local_88._8_4_ = uVar27;
        local_88._0_8_ = dVar7;
        unique0x100002dd = uVar28;
        local_e8 = pow((*v - (double)CONCAT44(uVar32,uVar31)) / dVar7,1.0 / (double)power);
        fVar25 = (float)((double)pIVar11->DragCurrentAccum / (double)local_88._0_8_ + local_e8);
        fVar26 = 1.0;
        if (fVar25 <= 1.0) {
          fVar26 = fVar25;
        }
        fVar26 = powf((float)(~-(uint)(fVar25 < 0.0) & (uint)fVar26),power);
        uVar31 = local_a8._0_4_;
        uVar32 = local_a8._4_4_;
        dVar7 = (double)fVar26 * (double)local_88._0_8_ + local_a8._0_8_;
        pcVar14 = extraout_RAX_07;
        uVar29 = local_b8._0_4_;
        uVar30 = local_b8._4_4_;
      }
      else {
        dVar7 = *v + (double)pIVar11->DragCurrentAccum;
        local_e8 = 0.0;
      }
      do {
        cVar1 = *format;
        if (cVar1 == '\0') {
          iVar21 = 3;
          pcVar15 = pcVar14;
        }
        else if ((cVar1 != '%') || (iVar21 = 1, pcVar15 = format, format[1] == '%')) {
          format = format + (ulong)(cVar1 == '%') + 1;
          iVar21 = 0;
          pcVar15 = pcVar14;
        }
        pcVar14 = pcVar15;
      } while (iVar21 == 0);
      if (iVar21 == 1) {
        format = pcVar15;
      }
      if ((*format == '%') && (format[1] != '%')) {
        ImFormatString(local_78,0x40,format,SUB84(dVar7,0));
        pcVar14 = &cStack_79;
        do {
          pcVar15 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
        } while (*pcVar15 == ' ');
        dVar7 = atof(pcVar14);
        uVar29 = local_b8._0_4_;
        uVar30 = local_b8._4_4_;
        uVar31 = local_a8._0_4_;
        uVar32 = local_a8._4_4_;
      }
      pIVar11->DragCurrentAccumDirty = false;
      if (bVar17) {
        dVar8 = pow((dVar7 - (double)CONCAT44(uVar32,uVar31)) /
                    ((double)CONCAT44(uVar30,uVar29) - (double)CONCAT44(uVar32,uVar31)),
                    1.0 / (double)power);
        dVar8 = dVar8 - local_e8;
        uVar29 = local_b8._0_4_;
        uVar30 = local_b8._4_4_;
      }
      else {
        dVar8 = dVar7 - *v;
      }
      pIVar11->DragCurrentAccum = pIVar11->DragCurrentAccum - (float)dVar8;
      dVar7 = (double)(~-(ulong)(dVar7 == 0.0) & (ulong)dVar7);
      uVar27 = SUB84(dVar7,0);
      uVar28 = (undefined4)((ulong)dVar7 >> 0x20);
      dVar8 = *v;
      if (!(bool)(~bVar9 & 1) && dVar7 != dVar8) {
        if ((dVar7 < (double)local_a8._0_8_) || ((dVar8 < dVar7 && ((float)local_98._0_4_ < 0.0))))
        {
          uVar27 = (undefined4)local_a8._0_8_;
          uVar28 = SUB84(local_a8._0_8_,4);
        }
        if (((double)CONCAT44(uVar30,uVar29) <= (double)CONCAT44(uVar28,uVar27) &&
             (double)CONCAT44(uVar28,uVar27) != (double)CONCAT44(uVar30,uVar29)) ||
           (((double)CONCAT44(uVar28,uVar27) <= dVar8 && dVar8 != (double)CONCAT44(uVar28,uVar27) &&
            (0.0 < (float)local_98._0_4_)))) {
          uVar27 = uVar29;
          uVar28 = uVar30;
        }
      }
      if ((dVar8 == (double)CONCAT44(uVar28,uVar27)) &&
         (!NAN(dVar8) && !NAN((double)CONCAT44(uVar28,uVar27)))) {
        bVar17 = dVar8 != (double)CONCAT44(uVar28,uVar27);
        goto LAB_0018f4b8;
      }
      *(ulong *)v = CONCAT44(uVar28,uVar27);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x24c0,
                    "bool ImGui::DragBehavior(ImGuiID, ImGuiDataType, void *, float, const void *, const void *, const char *, float)"
                   );
    }
    bVar17 = true;
  }
  else {
LAB_0018f250:
    bVar17 = false;
  }
  return bVar17;
}

Assistant:

bool ImGui::DragBehavior(ImGuiID id, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse && !g.IO.MouseDown[0])
            ClearActiveID();
        else if (g.ActiveIdSource == ImGuiInputSource_Nav && g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            ClearActiveID();
    }
    if (g.ActiveId != id)
        return false;

    switch (data_type)
    {
    case ImGuiDataType_S32:    return DragBehaviorT<ImS32, ImS32, float >(data_type, (ImS32*)v,  v_speed, v_min ? *(const ImS32* )v_min : IM_S32_MIN, v_max ? *(const ImS32* )v_max : IM_S32_MAX, format, power);
    case ImGuiDataType_U32:    return DragBehaviorT<ImU32, ImS32, float >(data_type, (ImU32*)v,  v_speed, v_min ? *(const ImU32* )v_min : IM_U32_MIN, v_max ? *(const ImU32* )v_max : IM_U32_MAX, format, power);
    case ImGuiDataType_S64:    return DragBehaviorT<ImS64, ImS64, double>(data_type, (ImS64*)v,  v_speed, v_min ? *(const ImS64* )v_min : IM_S64_MIN, v_max ? *(const ImS64* )v_max : IM_S64_MAX, format, power);
    case ImGuiDataType_U64:    return DragBehaviorT<ImU64, ImS64, double>(data_type, (ImU64*)v,  v_speed, v_min ? *(const ImU64* )v_min : IM_U64_MIN, v_max ? *(const ImU64* )v_max : IM_U64_MAX, format, power);
    case ImGuiDataType_Float:  return DragBehaviorT<float, float, float >(data_type, (float*)v,  v_speed, v_min ? *(const float* )v_min : -FLT_MAX,   v_max ? *(const float* )v_max : FLT_MAX,    format, power);
    case ImGuiDataType_Double: return DragBehaviorT<double,double,double>(data_type, (double*)v, v_speed, v_min ? *(const double*)v_min : -DBL_MAX,   v_max ? *(const double*)v_max : DBL_MAX,    format, power);
    case ImGuiDataType_COUNT:  break;
    }
    IM_ASSERT(0);
    return false;
}